

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhash.c
# Opt level: O3

void rhash_reset(rhash ctx)

{
  byte *pbVar1;
  uint uVar2;
  long lVar3;
  code *pcVar4;
  rhash prVar5;
  ulong uVar6;
  
  uVar2 = (uint)ctx[1].msg_size;
  if (uVar2 == 0) {
    __assert_fail("ectx->hash_vector_size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibrhash/librhash/rhash.c"
                  ,0xd1,"void rhash_reset(rhash)");
  }
  if (uVar2 < 0xb) {
    ctx[1].hash_id = 0xb01dbabe;
    prVar5 = ctx + 4;
    uVar6 = 0;
    while( true ) {
      lVar3 = *(long *)&prVar5[-1].hash_id;
      pcVar4 = *(code **)(lVar3 + 0x30);
      if (pcVar4 != (code *)0x0) {
        (*pcVar4)(prVar5->msg_size);
      }
      pcVar4 = *(code **)(lVar3 + 0x18);
      if (pcVar4 == (code *)0x0) break;
      (*pcVar4)(prVar5->msg_size);
      uVar6 = uVar6 + 1;
      prVar5 = prVar5 + 1;
      if ((uint)ctx[1].msg_size <= uVar6) {
        pbVar1 = (byte *)((long)&ctx[1].msg_size + 4);
        *pbVar1 = *pbVar1 & 0xfd;
        return;
      }
    }
    __assert_fail("info->init != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibrhash/librhash/rhash.c"
                  ,0xdc,"void rhash_reset(rhash)");
  }
  __assert_fail("ectx->hash_vector_size <= RHASH_HASH_COUNT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibrhash/librhash/rhash.c"
                ,0xd2,"void rhash_reset(rhash)");
}

Assistant:

RHASH_API void rhash_reset(rhash ctx)
{
	rhash_context_ext* const ectx = (rhash_context_ext*)ctx;
	unsigned i;

	assert(ectx->hash_vector_size > 0);
	assert(ectx->hash_vector_size <= RHASH_HASH_COUNT);
	ectx->state = STATE_ACTIVE; /* re-activate the structure */

	/* re-initialize every hash in a loop */
	for (i = 0; i < ectx->hash_vector_size; i++) {
		struct rhash_hash_info* info = ectx->vector[i].hash_info;
		if (info->cleanup != 0) {
			info->cleanup(ectx->vector[i].context);
		}

		assert(info->init != NULL);
		info->init(ectx->vector[i].context);
	}
	ectx->flags &= ~RCTX_FINALIZED; /* clear finalized state */
}